

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_interactive.cpp
# Opt level: O1

string * __thiscall
ftxui::(anonymous_namespace)::Serialize_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<ftxui::(anonymous_namespace)::DECMode,_std::allocator<ftxui::(anonymous_namespace)::DECMode>_>
          *parameters)

{
  uint uVar1;
  uint __val;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint __len;
  uint *puVar6;
  string __str;
  long *local_58 [2];
  long local_48 [2];
  uint *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar6 = *(uint **)this;
  local_38 = *(uint **)(this + 8);
  if (puVar6 != local_38) {
    bVar3 = true;
    do {
      uVar1 = *puVar6;
      if (!bVar3) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      __val = -uVar1;
      if (0 < (int)uVar1) {
        __val = uVar1;
      }
      __len = 1;
      if (9 < __val) {
        uVar5 = (ulong)__val;
        uVar2 = 4;
        do {
          __len = uVar2;
          uVar4 = (uint)uVar5;
          if (uVar4 < 100) {
            __len = __len - 2;
            goto LAB_00146e9d;
          }
          if (uVar4 < 1000) {
            __len = __len - 1;
            goto LAB_00146e9d;
          }
          if (uVar4 < 10000) goto LAB_00146e9d;
          uVar5 = uVar5 / 10000;
          uVar2 = __len + 4;
        } while (99999 < uVar4);
        __len = __len + 1;
      }
LAB_00146e9d:
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct((ulong)local_58,(char)__len - (char)((int)uVar1 >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_58[0]),__len,__val);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      puVar6 = puVar6 + 1;
      bVar3 = false;
    } while (puVar6 != local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string Serialize(std::vector<DECMode> parameters) {
  bool first = true;
  std::string out;
  for (DECMode parameter : parameters) {
    if (!first)
      out += ";";
    out += std::to_string(int(parameter));
    first = false;
  }
  return out;
}